

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::AtomicCmpxchg::finalize(AtomicCmpxchg *this)

{
  if ((((this->ptr->type).id == 1) || ((this->expected->type).id == 1)) ||
     ((this->replacement->type).id == 1)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)25>).super_Expression.type.id = 1;
  }
  return;
}

Assistant:

void AtomicCmpxchg::finalize() {
  if (ptr->type == Type::unreachable || expected->type == Type::unreachable ||
      replacement->type == Type::unreachable) {
    type = Type::unreachable;
  }
}